

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O2

dyn_tbl_t * dyn_tbl_init(uint length,int lgn,longlong T)

{
  dyn_tbl_t *pdVar1;
  undefined1 auVar2 [16];
  
  pdVar1 = (dyn_tbl_t *)operator_new(0x60);
  *(undefined8 *)&(pdVar1->array)._M_h._M_rehash_policy = 0;
  (pdVar1->array)._M_h._M_rehash_policy._M_next_resize = 0;
  (pdVar1->array)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pdVar1->total = 0;
  pdVar1->max_len = 0;
  pdVar1->decrement = 0;
  pdVar1->T = 0;
  pdVar1->max_value = 0;
  *(undefined8 *)&pdVar1->lgn = 0;
  (pdVar1->array)._M_h._M_buckets = &(pdVar1->array)._M_h._M_single_bucket;
  (pdVar1->array)._M_h._M_bucket_count = 1;
  auVar2 = ZEXT416(0) << 0x40;
  (pdVar1->array)._M_h._M_before_begin = (__node_base)auVar2._0_8_;
  (pdVar1->array)._M_h._M_element_count = auVar2._8_8_;
  (pdVar1->array)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pdVar1->array)._M_h._M_rehash_policy._M_next_resize = auVar2;
  pdVar1->lgn = lgn;
  pdVar1->max_len = length;
  pdVar1->total = 0;
  pdVar1->T = T;
  return pdVar1;
}

Assistant:

dyn_tbl_t* dyn_tbl_init(unsigned int length, int lgn, long long T) {
	dyn_tbl_t* ret = new dyn_tbl_t();
	ret->lgn = lgn;
	ret->max_len = length;
	ret->decrement = 0;
	ret->total = 0;
	ret->T = T;
	ret->max_value = 0;
	return ret;
}